

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

String * kj::getCaughtExceptionType(void)

{
  type_info *this;
  char *name;
  String *in_RDI;
  
  this = (type_info *)__cxa_current_exception_type();
  name = std::type_info::name(this);
  demangleTypeName(in_RDI,name);
  return in_RDI;
}

Assistant:

kj::String getCaughtExceptionType() {
  return demangleTypeName(abi::__cxa_current_exception_type()->name());
}